

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void releasePageOne(MemPage *pPage)

{
  Pager *pPager;
  
  pPager = pPage->pDbPage->pPager;
  sqlite3PcacheRelease(pPage->pDbPage);
  if (pPager->pPCache->nRefSum != 0) {
    return;
  }
  pagerUnlockAndRollback(pPager);
  return;
}

Assistant:

static void releasePageOne(MemPage *pPage){
  assert( pPage!=0 );
  assert( pPage->aData );
  assert( pPage->pBt );
  assert( pPage->pDbPage!=0 );
  assert( sqlite3PagerGetExtra(pPage->pDbPage) == (void*)pPage );
  assert( sqlite3PagerGetData(pPage->pDbPage)==pPage->aData );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  sqlite3PagerUnrefPageOne(pPage->pDbPage);
}